

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O1

void __thiscall Imf_2_5::Header::erase(Header *this,char *name)

{
  iterator __position;
  ArgExc *this_00;
  stringstream _iex_throw_s;
  key_type kStack_198;
  
  if (*name != '\0') {
    strncpy(kStack_198._text,name,0xff);
    kStack_198._text[0xff] = '\0';
    __position = std::
                 _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
                 ::find((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
                         *)this,&kStack_198);
    if ((_Rb_tree_header *)__position._M_node != &(this->_map)._M_t._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<Imf_2_5::Name,std::pair<Imf_2_5::Name_const,Imf_2_5::Attribute*>,std::_Select1st<std::pair<Imf_2_5::Name_const,Imf_2_5::Attribute*>>,std::less<Imf_2_5::Name>,std::allocator<std::pair<Imf_2_5::Name_const,Imf_2_5::Attribute*>>>
      ::erase_abi_cxx11_((_Rb_tree<Imf_2_5::Name,std::pair<Imf_2_5::Name_const,Imf_2_5::Attribute*>,std::_Select1st<std::pair<Imf_2_5::Name_const,Imf_2_5::Attribute*>>,std::less<Imf_2_5::Name>,std::allocator<std::pair<Imf_2_5::Name_const,Imf_2_5::Attribute*>>>
                          *)this,__position);
    }
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&kStack_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(kStack_198._text + 0x10),"Image attribute name cannot be an empty string.",
             0x2f);
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this_00,(stringstream *)&kStack_198);
  __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
Header::erase (const char name[])
{
    if (name[0] == 0)
        THROW (IEX_NAMESPACE::ArgExc, "Image attribute name cannot be an empty string.");
    
    
    AttributeMap::iterator i = _map.find (name);
    if (i != _map.end())
        _map.erase (i);

}